

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O1

size_t __thiscall
adios2::utils::Reorganize::Decompose(Reorganize *this,int numproc,int rank,VarInfo *vi,int *np)

{
  unsigned_long uVar1;
  iterator iVar2;
  int iVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ostream *poVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  size_type __n;
  long lVar10;
  ulong uVar11;
  size_t count;
  size_t start;
  string ints;
  vector<int,_std::allocator<int>_> pos;
  unsigned_long local_b8;
  int local_ac;
  Reorganize *local_a8;
  unsigned_long local_a0;
  string local_98;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_78;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  string local_50;
  
  if (vi->v != (VariableBase *)0x0) {
    if (*(int *)(vi->v + 0x40) != 5) {
      local_ac = rank;
      adios2::core::VariableBase::Shape((ulong)&local_98);
      sVar5 = local_98._M_string_length;
      _Var4._M_p = local_98._M_dataplus._M_p;
      if (local_98._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      iVar3 = local_ac;
      if ((pointer)sVar5 == _Var4._M_p) {
        return (ulong)(local_ac == 0);
      }
      __n = (long)(sVar5 - (long)_Var4._M_p) >> 3;
      local_a8 = this;
      std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,(allocator_type *)&local_98);
      local_78 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&vi->start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,__n);
      local_70 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&vi->count;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,__n);
      if (__n == 1) {
        lVar7 = 0;
        iVar9 = 1;
      }
      else {
        iVar9 = 1;
        lVar7 = 0;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7] =
               (int)((long)((ulong)(uint)((int)((long)iVar3 / (long)iVar9) >> 0x1f) << 0x20 |
                           (long)iVar3 / (long)iVar9 & 0xffffffffU) % (long)np[lVar7]);
          iVar9 = iVar9 * np[lVar7];
          lVar7 = lVar7 + 1;
        } while (__n - 1 != lVar7);
      }
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = iVar3 / iVar9;
      VectorToString<std::vector<int,std::allocator<int>>>(&local_98,local_a8,&local_68);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[__n - 1] < np[__n - 1]) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rank ",5);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": position in ",0xe);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-D decomposition = ",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rank ",5);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": position in ",0xe);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-D decomposition = ",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ---> Out of bound process",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((pointer)sVar5 == _Var4._M_p) {
        sVar8 = 1;
      }
      else {
        sVar8 = 1;
        lVar7 = 0;
        do {
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[__n - 1] < np[__n - 1]) {
            adios2::core::VariableBase::Shape((ulong)&local_50);
            local_b8 = *(ulong *)(local_50._M_dataplus._M_p + lVar7 * 8) / (ulong)(long)np[lVar7];
            if (local_50._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            local_a0 = (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar7] * local_b8;
            if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7] == np[lVar7] + -1) {
              adios2::core::VariableBase::Shape((ulong)&local_50);
              local_b8 = *(long *)(local_50._M_dataplus._M_p + lVar7 * 8) -
                         ((long)np[lVar7] + -1) * local_b8;
              if (local_50._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
          }
          else {
            local_b8 = 0;
            local_a0 = 0;
          }
          iVar2._M_current =
               (vi->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (vi->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_78,iVar2,&local_a0);
          }
          else {
            *iVar2._M_current = local_a0;
            (vi->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          iVar2._M_current =
               (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_70,iVar2,&local_b8);
          }
          else {
            *iVar2._M_current = local_b8;
            (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          sVar8 = sVar8 * local_b8;
          lVar7 = lVar7 + 1;
        } while (__n + (__n == 0) != lVar7);
      }
      VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (&local_50,local_a8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
      iVar3 = local_ac;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rank ",5);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ldims in ",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-D space = {",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (&local_50,local_a8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rank ",5);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": offsets in ",0xd);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-D space = {",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return sVar8;
      }
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return sVar8;
    }
    if (rank == 0) {
      lVar7 = *(long *)(vi->v + 0x88);
      if (*(long *)(vi->v + 0x90) != lVar7) {
        sVar8 = 1;
        lVar10 = 0;
        uVar11 = 0;
        do {
          uVar1 = *(unsigned_long *)(lVar7 + lVar10);
          iVar2._M_current =
               (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&vi->count,iVar2,
                       (unsigned_long *)(lVar7 + lVar10));
          }
          else {
            *iVar2._M_current = uVar1;
            (vi->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          sVar8 = sVar8 * uVar1;
          uVar11 = uVar11 + 1;
          lVar7 = *(long *)(vi->v + 0x88);
          lVar10 = lVar10 + 8;
        } while (uVar11 < (ulong)(*(long *)(vi->v + 0x90) - lVar7 >> 3));
        return sVar8;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

size_t Reorganize::Decompose(int numproc, int rank, VarInfo &vi,
                             const int *np // number of processes in each dimension
)
{
    size_t writesize = 0;
    if (vi.v == nullptr)
    {
        return writesize;
    }

    /* Handle local array: only one block for now */
    if (vi.v->m_ShapeID == adios2::ShapeID::LocalArray)
    {
        if (rank == 0)
        {
            writesize = 1;
            for (size_t i = 0; i < vi.v->m_Count.size(); i++)
            {
                writesize *= vi.v->m_Count[i];
                // vi.start.push_back(0);
                vi.count.push_back(vi.v->m_Count[i]);
            }
        }
        else
        {
            writesize = 0;
        }
        return writesize;
    }

    size_t ndim = vi.v->Shape().size();

    /* Scalars */
    if (ndim == 0)
    {
        // scalars -> rank 0 writes them
        if (rank == 0)
            writesize = 1;
        else
            writesize = 0;
        return writesize;
    }

    /* Global Arrays */
    /* calculate this process' position in the n-dim space
    0 1 2
    3 4 5
    6 7 8

    for 1D:
    posx = rank/1             ! 1st dim: 0, 1, 2...,rank-1 are in the same X
    position

    for 2D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = rank/(npx)         ! 2nd dim: npx processes belong into one dim

    for 3D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = mod(rank/npx, npy) ! 2nd dim: (0, npx-1) have the same dim (so divide
    with npx first)
    posz = rank/(npx*npy)     ! 3rd dim: npx*npy processes belong into one dim
    */
    int nps = 1;
    std::vector<int> pos(ndim); // rank's position in each dimensions
    vi.start.reserve(ndim);
    vi.count.reserve(ndim);

    size_t i = 0;
    for (i = 0; i < ndim - 1; i++)
    {
        pos[i] = (rank / nps) % np[i];
        nps *= np[i];
    }
    pos[i] = rank / nps;

    std::string ints = VectorToString(pos);
    if (pos[ndim - 1] >= np[ndim - 1])
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << " ---> Out of bound process" << std::endl;
    }
    else
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << std::endl;
    }

    /* Decompose each dimension according to the position */
    writesize = 1;
    for (i = 0; i < ndim; i++)
    {
        size_t start, count;
        if (pos[ndim - 1] >= np[ndim - 1])
        {
            // this process gets nothing to read
            count = 0;
            start = 0;
        }
        else
        {
            count = vi.v->Shape()[i] / np[i];
            start = count * pos[i];
            if (pos[i] == np[i] - 1)
            {
                // last one in the dimension may need to read more than the rest
                count = vi.v->Shape()[i] - count * (np[i] - 1);
            }
        }
        vi.start.push_back(start);
        vi.count.push_back(count);
        writesize *= count;
    }
    ints = VectorToString(vi.count);
    std::cout << "rank " << rank << ": ldims in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    ints = VectorToString(vi.start);
    std::cout << "rank " << rank << ": offsets in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    return writesize;
}